

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::Test<unsigned_int,3,false,2u>
          (StorageMultisampleTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  GLenum GVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  bool result;
  Functions *gl;
  StorageMultisampleTest *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar6 + 0xff0))(0xcf5,4);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glPixelStorei has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd69);
  (**(code **)(lVar6 + 0xff0))(0xd05,4);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glPixelStorei has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd6c);
  CreateInputTexture<unsigned_int,3,false,2u>(this);
  GVar4 = Reference::InternalFormat<unsigned_int,3,false>();
  bVar1 = PrepareFramebufferMultisample<2u>(this,GVar4);
  if (bVar1) {
    GVar4 = Reference::InternalFormat<unsigned_int,3,false>();
    PrepareFramebufferAuxiliary<2u>(this,GVar4);
    Draw<2u>(this);
    this_local._7_1_ = Check<unsigned_int,3,false,2u>(this);
    CleanAuxiliaryTexture(this);
    CleanFramebuffers(this);
    CleanInputTexture(this);
    CleanErrors(this);
  }
  else {
    CleanInputTexture(this);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool StorageMultisampleTest::Test()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup. */
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, sizeof(T));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei has failed");

	gl.pixelStorei(GL_PACK_ALIGNMENT, sizeof(T));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei has failed");

	CreateInputTexture<T, S, N, D>();

	if (!PrepareFramebufferMultisample<D>(InternalFormat<T, S, N>()))
	{
		CleanInputTexture();

		return false;
	}

	PrepareFramebufferAuxiliary<D>(InternalFormat<T, S, N>());

	/* Action. */
	Draw<D>();

	/* Compare results with reference. */
	bool result = Check<T, S, N, D>();

	/* Cleanup. */
	CleanAuxiliaryTexture();
	CleanFramebuffers();
	CleanInputTexture();
	CleanErrors();

	/* Pass result. */
	return result;
}